

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.cpp
# Opt level: O1

void __thiscall libtorrent::aux::alert_manager::maybe_notify(alert_manager *this,alert *a)

{
  _List_node_base *p_Var1;
  
  if ((this->m_alerts).super_array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>._M_elems
      [this->m_generation].m_num_items == 1) {
    if ((this->m_notify).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_notify)._M_invoker)((_Any_data *)&this->m_notify);
    }
    ::std::_V2::condition_variable_any::notify_all(&this->m_condition);
  }
  for (p_Var1 = (this->m_ses_extensions).
                super__List_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->m_ses_extensions; p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x38))(p_Var1[1]._M_next,a);
  }
  return;
}

Assistant:

void alert_manager::maybe_notify(alert* a)
	{
		if (m_alerts[m_generation].size() == 1)
		{
			// we just posted to an empty queue. If anyone is waiting for
			// alerts, we need to notify them. Also (potentially) call the
			// user supplied m_notify callback to let the client wake up its
			// message loop to poll for alerts.
			if (m_notify) m_notify();

			// TODO: 2 keep a count of the number of threads waiting. Only if it's
			// > 0 notify them
			m_condition.notify_all();
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& e : m_ses_extensions)
			e->on_alert(a);
#else
		TORRENT_UNUSED(a);
#endif
	}